

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgviz.hpp
# Opt level: O0

imgviz * __thiscall
imgviz::tile(imgviz *this,vector<cv::Mat,_std::allocator<cv::Mat>_> *images,Vec2i *shape,
            uint border_width,Scalar *border_color)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  const_reference pvVar6;
  size_type sVar7;
  int *piVar8;
  uint *puVar9;
  ulong uVar10;
  int iVar11;
  _OutputArray local_548;
  _InputArray local_530;
  _InputArray local_518;
  _OutputArray local_500;
  _InputArray local_4e8;
  _InputArray local_4d0;
  _InputArray local_4b8;
  undefined1 local_4a0 [8];
  Mat border_1;
  _OutputArray local_440;
  _InputArray local_428;
  _InputArray local_410;
  _OutputArray local_3f8;
  _InputArray local_3e0;
  _InputArray local_3c8;
  _InputArray local_3b0;
  undefined1 local_398 [8];
  Mat border;
  _InputArray local_338;
  _InputArray local_320;
  MatExpr local_308 [352];
  Size_<int> local_1a8;
  imgviz local_1a0 [112];
  Mat local_130 [8];
  Mat image;
  size_t index;
  size_t i_1;
  Mat dst_row;
  ulong local_60;
  size_t j;
  uint cols;
  uint rows;
  ulong local_40;
  size_t i;
  uint width;
  uint height;
  Scalar *border_color_local;
  Vec2i *pVStack_20;
  uint border_width_local;
  Vec2i *shape_local;
  vector<cv::Mat,_std::allocator<cv::Mat>_> *images_local;
  Mat *dst;
  
  iVar11 = (int)border_color;
  _width = border_color;
  border_color_local._4_4_ = border_width;
  pVStack_20 = shape;
  shape_local = (Vec2i *)images;
  images_local = (vector<cv::Mat,_std::allocator<cv::Mat>_> *)this;
  pvVar6 = std::vector<cv::Mat,_std::allocator<cv::Mat>_>::operator[](images,0);
  i._4_4_ = *(uint *)(pvVar6 + 8);
  pvVar6 = std::vector<cv::Mat,_std::allocator<cv::Mat>_>::operator[](images,0);
  i._0_4_ = *(uint *)(pvVar6 + 0xc);
  for (local_40 = 1; uVar10 = local_40,
      sVar7 = std::vector<cv::Mat,_std::allocator<cv::Mat>_>::size(images), uVar10 < sVar7;
      local_40 = local_40 + 1) {
    pvVar6 = std::vector<cv::Mat,_std::allocator<cv::Mat>_>::operator[](images,local_40);
    if (i._4_4_ < *(uint *)(pvVar6 + 8)) {
      pvVar6 = std::vector<cv::Mat,_std::allocator<cv::Mat>_>::operator[](images,local_40);
      i._4_4_ = *(uint *)(pvVar6 + 8);
    }
    pvVar6 = std::vector<cv::Mat,_std::allocator<cv::Mat>_>::operator[](images,local_40);
    if ((uint)i < *(uint *)(pvVar6 + 0xc)) {
      pvVar6 = std::vector<cv::Mat,_std::allocator<cv::Mat>_>::operator[](images,local_40);
      i._0_4_ = *(uint *)(pvVar6 + 0xc);
    }
  }
  piVar8 = cv::Vec<int,_2>::operator[](shape,0);
  iVar5 = *piVar8;
  piVar8 = cv::Vec<int,_2>::operator[](shape,1);
  if (iVar5 * *piVar8 == 0) {
    sVar7 = std::vector<cv::Mat,_std::allocator<cv::Mat>_>::size(images);
    getTileShape((imgviz *)&cols,(uint)sVar7,(double)i._4_4_ / (double)(uint)i);
    *(undefined8 *)(shape->super_Matx<int,_2,_1>).val = _cols;
  }
  puVar9 = (uint *)cv::Vec<int,_2>::operator[](shape,0);
  uVar1 = *puVar9;
  puVar9 = (uint *)cv::Vec<int,_2>::operator[](shape,1);
  uVar2 = *puVar9;
  cv::Mat::Mat((Mat *)this);
  local_60 = 0;
  do {
    if (uVar1 <= local_60) {
      return this;
    }
    cv::Mat::Mat((Mat *)&i_1);
    for (index = 0; index < uVar2; index = index + 1) {
      uVar10 = local_60 * uVar2 + index;
      cv::Mat::Mat(local_130);
      sVar7 = std::vector<cv::Mat,_std::allocator<cv::Mat>_>::size(images);
      uVar4 = i._4_4_;
      uVar3 = (uint)i;
      if (uVar10 < sVar7) {
        pvVar6 = std::vector<cv::Mat,_std::allocator<cv::Mat>_>::operator[](images,uVar10);
        cv::Mat::operator=(local_130,pvVar6);
        cv::Size_<int>::Size_(&local_1a8,(uint)i,i._4_4_);
        centerize(local_1a0,local_130,&local_1a8);
        cv::Mat::operator=(local_130,(Mat *)local_1a0);
        cv::Mat::~Mat((Mat *)local_1a0);
      }
      else {
        pvVar6 = std::vector<cv::Mat,_std::allocator<cv::Mat>_>::operator[](images,0);
        cv::Mat::type(pvVar6);
        cv::Mat::zeros((int)local_308,uVar4,uVar3);
        cv::Mat::operator=(local_130,local_308);
        cv::MatExpr::~MatExpr(local_308);
      }
      iVar5 = cv::Mat::type(local_130);
      if (iVar5 == 0) {
        cv::_InputArray::_InputArray(&local_320,local_130);
        cv::_OutputArray::_OutputArray((_OutputArray *)&local_338,local_130);
        cv::cvtColor((cv *)&local_320,&local_338,(_OutputArray *)0x8,0,iVar11);
        cv::_OutputArray::~_OutputArray((_OutputArray *)&local_338);
        cv::_InputArray::~_InputArray(&local_320);
      }
      iVar5 = cv::Mat::type(local_130);
      if (iVar5 != 0x10) {
        __assert_fail("image.type() == CV_8UC3",
                      "/workspace/llm4binary/github/license_c_cmakelists/wkentaro[P]imgviz-cpp/include/imgviz.hpp"
                      ,0xa8,
                      "cv::Mat imgviz::tile(const std::vector<cv::Mat>, cv::Vec2i, const unsigned int, const cv::Scalar)"
                     );
      }
      if (index == 0) {
        cv::Mat::operator=((Mat *)&i_1,local_130);
      }
      else {
        if (border_color_local._4_4_ != 0) {
          cv::Mat::Mat((Mat *)local_398,_dst_row,border_color_local._4_4_,0x10);
          cv::_InputArray::_InputArray<double,4,1>(&local_3b0,(Matx<double,_4,_1> *)border_color);
          cv::noArray();
          cv::Mat::setTo((_InputArray *)local_398,&local_3b0);
          cv::_InputArray::~_InputArray(&local_3b0);
          cv::_InputArray::_InputArray(&local_3c8,(Mat *)&i_1);
          cv::_InputArray::_InputArray(&local_3e0,(Mat *)local_398);
          cv::_OutputArray::_OutputArray(&local_3f8,(Mat *)&i_1);
          cv::hconcat(&local_3c8,&local_3e0,&local_3f8);
          cv::_OutputArray::~_OutputArray(&local_3f8);
          cv::_InputArray::~_InputArray(&local_3e0);
          cv::_InputArray::~_InputArray(&local_3c8);
          cv::Mat::~Mat((Mat *)local_398);
        }
        cv::_InputArray::_InputArray(&local_410,(Mat *)&i_1);
        cv::_InputArray::_InputArray(&local_428,local_130);
        cv::_OutputArray::_OutputArray(&local_440,(Mat *)&i_1);
        cv::hconcat(&local_410,&local_428,&local_440);
        cv::_OutputArray::~_OutputArray(&local_440);
        cv::_InputArray::~_InputArray(&local_428);
        cv::_InputArray::~_InputArray(&local_410);
      }
      cv::Mat::~Mat(local_130);
    }
    if (local_60 == 0) {
      cv::Mat::operator=((Mat *)this,(Mat *)&i_1);
    }
    else {
      if (border_color_local._4_4_ != 0) {
        cv::Mat::Mat((Mat *)local_4a0,border_color_local._4_4_,*(int *)(this + 0xc),0x10);
        cv::_InputArray::_InputArray<double,4,1>(&local_4b8,(Matx<double,_4,_1> *)border_color);
        cv::noArray();
        cv::Mat::setTo((_InputArray *)local_4a0,&local_4b8);
        cv::_InputArray::~_InputArray(&local_4b8);
        cv::_InputArray::_InputArray(&local_4d0,(Mat *)this);
        cv::_InputArray::_InputArray(&local_4e8,(Mat *)local_4a0);
        cv::_OutputArray::_OutputArray(&local_500,(Mat *)this);
        cv::vconcat(&local_4d0,&local_4e8,&local_500);
        cv::_OutputArray::~_OutputArray(&local_500);
        cv::_InputArray::~_InputArray(&local_4e8);
        cv::_InputArray::~_InputArray(&local_4d0);
        cv::Mat::~Mat((Mat *)local_4a0);
      }
      cv::_InputArray::_InputArray(&local_518,(Mat *)this);
      cv::_InputArray::_InputArray(&local_530,(Mat *)&i_1);
      cv::_OutputArray::_OutputArray(&local_548,(Mat *)this);
      cv::vconcat(&local_518,&local_530,&local_548);
      cv::_OutputArray::~_OutputArray(&local_548);
      cv::_InputArray::~_InputArray(&local_530);
      cv::_InputArray::~_InputArray(&local_518);
    }
    cv::Mat::~Mat((Mat *)&i_1);
    local_60 = local_60 + 1;
  } while( true );
}

Assistant:

cv::Mat tile(const std::vector<cv::Mat> images,
             cv::Vec2i shape = cv::Vec2i(0, 0), const unsigned border_width = 5,
             const cv::Scalar border_color = cv::Scalar(255, 255, 255)) {
  unsigned height = images[0].rows;
  unsigned width = images[0].cols;
  for (size_t i = 1; i < images.size(); i++) {
    if (images[i].rows > height) {
      height = images[i].rows;
    }
    if (images[i].cols > width) {
      width = images[i].cols;
    }
  }

  if (shape[0] * shape[1] == 0) {
    shape = getTileShape(/*size=*/images.size(),
                         /*hw_ratio=*/static_cast<double>(height) /
                             static_cast<double>(width));
  }
  unsigned rows = shape[0];
  unsigned cols = shape[1];

  cv::Mat dst;
  for (size_t j = 0; j < rows; j++) {
    cv::Mat dst_row;
    for (size_t i = 0; i < cols; i++) {
      size_t index = j * cols + i;

      cv::Mat image;
      if (index < images.size()) {
        image = images[index];
        image = centerize(image, cv::Size(width, height));
      } else {
        image = cv::Mat::zeros(height, width, images[0].type());
      }

      if (image.type() == CV_8UC1) {
        cv::cvtColor(image, image, cv::COLOR_GRAY2BGR);
      }
      assert(image.type() == CV_8UC3);

      if (i == 0) {
        dst_row = image;
      } else {
        if (border_width != 0) {
          cv::Mat border = cv::Mat(dst_row.rows, border_width, CV_8UC3);
          border.setTo(border_color);
          cv::hconcat(dst_row, border, dst_row);
        }
        cv::hconcat(dst_row, image, dst_row);
      }
    }
    if (j == 0) {
      dst = dst_row;
    } else {
      if (border_width != 0) {
        cv::Mat border = cv::Mat(border_width, dst.cols, CV_8UC3);
        border.setTo(border_color);
        cv::vconcat(dst, border, dst);
      }
      cv::vconcat(dst, dst_row, dst);
    }
  }

  return dst;
}